

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

DatabaseInterface * Fossilize::create_database(char *path,DatabaseMode mode)

{
  int iVar1;
  DatabaseInterface *pDVar2;
  string ext;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,path,&local_59);
  Path::ext(&local_58,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar1 == 0) {
    pDVar2 = create_stream_archive_database(path,mode);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_58);
    if (iVar1 == 0) {
      pDVar2 = create_zip_archive_database(path,mode);
    }
    else {
      pDVar2 = create_dumb_folder_database(path,mode);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return pDVar2;
}

Assistant:

DatabaseInterface *create_database(const char *path, DatabaseMode mode)
{
	auto ext = Path::ext(path);
	if (ext == "foz")
		return create_stream_archive_database(path, mode);
	else if (ext == "zip")
		return create_zip_archive_database(path, mode);
	else
		return create_dumb_folder_database(path, mode);
}